

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O1

void DispFootGroundingData(FootStatus_t FootGrounding)

{
  char *pcVar1;
  
  pcVar1 = "[LF]";
  if ((FootGrounding & 1) == 0) {
    pcVar1 = " LF ";
  }
  printf(pcVar1);
  pcVar1 = "[RH]";
  if ((FootGrounding & 2) == 0) {
    pcVar1 = " RH ";
  }
  printf(pcVar1);
  pcVar1 = "[RF]";
  if ((FootGrounding & 4) == 0) {
    pcVar1 = " RF ";
  }
  printf(pcVar1);
  pcVar1 = "[LH]";
  if ((FootGrounding & 8) == 0) {
    pcVar1 = " LH ";
  }
  printf(pcVar1);
  putchar(10);
  return;
}

Assistant:

void DispFootGroundingData(FootStatus_t FootGrounding)
{
	if (FootGrounding & 0x01)
		printf("[LF]");
	else
		printf(" LF ");

	if (FootGrounding & 0x02)
		printf("[RH]");
	else
		printf(" RH ");

	if (FootGrounding & 0x04)
		printf("[RF]");
	else
		printf(" RF ");

	if (FootGrounding & 0x08)
		printf("[LH]");
	else
		printf(" LH ");

	printf("\n");
}